

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

http_string_t get_request_header(http_context_t *ctx,char *key)

{
  nh_kv_anchor_t *pnVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  http_string_t hVar7;
  
  sVar3 = strlen(key);
  uVar4 = (ulong)(ctx->header).length;
  if (uVar4 == 0) {
    uVar4 = 0;
    pcVar5 = (char *)0x0;
  }
  else {
    pnVar1 = (ctx->header).items;
    lVar6 = 0;
    do {
      if (sVar3 == *(uint *)((long)&(pnVar1->key).len + lVar6)) {
        pcVar5 = (ctx->raw).buf;
        iVar2 = nh_string_cmp_case_insensitive
                          (key,pcVar5 + *(uint *)((long)&(pnVar1->key).index + lVar6),(int)sVar3);
        if (iVar2 != 0) {
          uVar4 = (ulong)*(uint *)((long)&(pnVar1->value).len + lVar6);
          pcVar5 = pcVar5 + *(uint *)((long)&(pnVar1->value).index + lVar6);
          goto LAB_00105a33;
        }
      }
      lVar6 = lVar6 + 0x10;
    } while (uVar4 << 4 != lVar6);
    pcVar5 = (char *)0x0;
    uVar4 = 0;
  }
LAB_00105a33:
  hVar7.len = uVar4;
  hVar7.value = pcVar5;
  return hVar7;
}

Assistant:

http_string_t get_request_header(http_context_t *ctx, char const key[static 1]) {
    size_t len = strlen(key);
    nh_kv_anchor_t cur;
    for (uint32_t i = 0; i < ctx->header.length; ++i) {
        cur = ctx->header.items[i];
        if (cur.key.len == len && nh_string_cmp_case_insensitive(key, &ctx->raw.buf[cur.key.index], len)) {
            return (http_string_t) {
                .value = &ctx->raw.buf[cur.value.index],
                .len = cur.value.len,
            };
        }
    }
    return (http_string_t) {};
}